

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rough_conductor.hpp
# Opt level: O1

Color __thiscall RoughConductorBRDF::f(RoughConductorBRDF *this,Color *albedo,vec3f *wo,vec3f *wi)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  Color CVar40;
  float local_48;
  float fStack_44;
  float local_38;
  float fStack_34;
  
  fVar26 = wo->z + wi->z;
  uVar7 = wo->x;
  uVar14 = wo->y;
  uVar8 = wi->x;
  uVar15 = wi->y;
  fVar33 = (float)uVar8 + (float)uVar7;
  fVar34 = (float)uVar15 + (float)uVar14;
  fVar19 = fVar26 * fVar26 + fVar33 * fVar33 + fVar34 * fVar34;
  if (fVar19 < 0.0) {
    fVar19 = sqrtf(fVar19);
  }
  else {
    fVar19 = SQRT(fVar19);
  }
  fVar35 = PI;
  fVar19 = 1.0 / fVar19;
  fVar26 = fVar26 * fVar19;
  fVar33 = fVar33 * fVar19;
  fVar34 = fVar34 * fVar19;
  fVar19 = wo->z;
  fVar39 = -fVar26;
  fVar21 = fVar33;
  fVar37 = fVar34;
  if (fVar26 < fVar39) {
    fVar21 = -fVar33;
    fVar37 = -fVar34;
  }
  fVar1 = wo->x;
  fVar2 = wo->y;
  fVar3 = *(float *)&(this->super_BRDF).field_0x10;
  uVar12 = *(undefined8 *)&(this->super_BRDF).field_0x8;
  uVar13 = *(undefined8 *)&(this->super_BRDF).field_0x14;
  fVar36 = (float)uVar13;
  fVar38 = (float)((ulong)uVar13 >> 0x20);
  fVar4 = *(float *)&this->field_0x1c;
  fVar5 = this->alpha;
  uVar9 = wo->x;
  uVar16 = wo->y;
  uVar10 = wi->x;
  uVar17 = wi->y;
  fVar6 = wi->z;
  fVar25 = 1.0 - fVar19 * fVar19;
  fVar20 = 0.0;
  if (0.0 < fVar25) {
    if (fVar25 < 0.0) {
      fVar25 = sqrtf(fVar25);
    }
    else {
      fVar25 = SQRT(fVar25);
    }
    fVar20 = fVar25 / fVar19;
  }
  fVar25 = 1.0;
  if ((fVar20 != 0.0) || (NAN(fVar20))) {
    fVar22 = fVar39;
    if (fVar39 <= fVar26) {
      fVar22 = fVar26;
    }
    fVar25 = 0.0;
    if (0.0 < (fVar22 * fVar19 + (float)uVar9 * fVar21 + fVar37 * (float)uVar16) * fVar19) {
      fVar21 = ABS(fVar20) * fVar5 * ABS(fVar20) * fVar5 + 1.0;
      if (fVar21 < 0.0) {
        fVar21 = sqrtf(fVar21);
      }
      else {
        fVar21 = SQRT(fVar21);
      }
      fVar25 = 2.0 / (fVar21 + 1.0);
    }
  }
  fVar21 = fVar33;
  fVar37 = fVar34;
  if (fVar26 < 0.0) {
    fVar21 = -fVar33;
    fVar37 = -fVar34;
  }
  fVar20 = 1.0 - fVar6 * fVar6;
  fVar22 = 0.0;
  if (0.0 < fVar20) {
    if (fVar20 < 0.0) {
      fVar20 = sqrtf(fVar20);
    }
    else {
      fVar20 = SQRT(fVar20);
    }
    fVar22 = fVar20 / fVar6;
  }
  fVar20 = 1.0;
  if ((fVar22 != 0.0) || (NAN(fVar22))) {
    fVar20 = 0.0;
    if (0.0 < ((float)(~-(uint)(fVar26 < 0.0) & (uint)fVar26 | -(uint)(fVar26 < 0.0) & (uint)fVar39)
               * fVar6 + (float)uVar10 * fVar21 + fVar37 * (float)uVar17) * fVar6) {
      fVar21 = ABS(fVar22) * fVar5 * ABS(fVar22) * fVar5 + 1.0;
      if (fVar21 < 0.0) {
        fVar21 = sqrtf(fVar21);
      }
      else {
        fVar21 = SQRT(fVar21);
      }
      fVar20 = 2.0 / (fVar21 + 1.0);
    }
  }
  fVar21 = fVar39 * fVar26 + 1.0;
  auVar23._0_4_ = (undefined4)DAT_001590e0;
  auVar23._4_4_ = fVar5;
  auVar23._8_4_ = DAT_001590e0._4_4_;
  auVar23._12_4_ = 0;
  auVar30._4_4_ =
       (fVar5 * fVar5 + (float)(-(uint)(0.0 < fVar21) & (uint)(fVar21 / (fVar26 * fVar26)))) *
       fVar26 * fVar26;
  auVar30._0_4_ = fVar35;
  auVar30._8_8_ = 0;
  auVar24 = divps(auVar23,auVar30);
  fVar33 = fVar19 * fVar26 + fVar1 * fVar33 + fVar34 * fVar2;
  fVar19 = fVar33 * fVar33;
  fVar26 = (fVar3 + fVar3) * fVar33;
  fVar34 = fVar4 * fVar4 + fVar3 * fVar3;
  auVar27._0_4_ = (fVar34 - fVar26) + fVar19;
  auVar27._4_4_ = (fVar19 * fVar34 - fVar26) + 1.0;
  auVar27._8_4_ = (0.0 - fVar26) + 0.0;
  auVar27._12_4_ = (0.0 - fVar26) + 0.0;
  auVar28._4_4_ = fVar26 + fVar19 * fVar34 + 1.0;
  auVar28._0_4_ = fVar26 + fVar34 + fVar19;
  auVar28._8_4_ = fVar26 + 0.0 + 0.0;
  auVar28._12_4_ = fVar26 + 0.0 + 0.0;
  auVar28 = divps(auVar27,auVar28);
  local_38 = (float)uVar12;
  fStack_34 = (float)((ulong)uVar12 >> 0x20);
  fVar37 = fVar36 * fVar36 + local_38 * local_38;
  fVar39 = fVar38 * fVar38 + fStack_34 * fStack_34;
  fVar26 = (auVar24._4_4_ * auVar24._4_4_ * auVar24._0_4_ * fVar25 * fVar20) / (wo->z * 4.0 * wi->z)
  ;
  fVar34 = fVar33 * (local_38 + local_38);
  fVar35 = fVar33 * (fStack_34 + fStack_34);
  fVar21 = fVar33 * 0.0;
  fVar33 = fVar33 * 0.0;
  auVar29._0_4_ = (fVar19 * fVar37 - fVar34) + 1.0;
  auVar29._4_4_ = (fVar19 * fVar39 - fVar35) + 1.0;
  auVar29._8_4_ = (fVar19 * 0.0 - fVar21) + 0.0;
  auVar29._12_4_ = (fVar19 * 0.0 - fVar33) + 0.0;
  auVar31._0_4_ = fVar34 + fVar19 * fVar37 + 1.0;
  auVar31._4_4_ = fVar35 + fVar19 * fVar39 + 1.0;
  auVar31._8_4_ = fVar21 + fVar19 * 0.0 + 0.0;
  auVar31._12_4_ = fVar33 + fVar19 * 0.0 + 0.0;
  auVar30 = divps(auVar29,auVar31);
  auVar32._0_4_ = (fVar37 - fVar34) + fVar19;
  auVar32._4_4_ = (fVar39 - fVar35) + fVar19;
  auVar32._8_4_ = (0.0 - fVar21) + fVar19;
  auVar32._12_4_ = (0.0 - fVar33) + fVar19;
  auVar24._4_4_ = fVar35 + fVar39 + fVar19;
  auVar24._0_4_ = fVar34 + fVar37 + fVar19;
  auVar24._8_4_ = fVar21 + 0.0 + fVar19;
  auVar24._12_4_ = fVar33 + 0.0 + fVar19;
  auVar24 = divps(auVar32,auVar24);
  uVar11 = albedo->x;
  uVar18 = albedo->y;
  CVar40.x = (float)uVar11 * fVar26 * (auVar24._0_4_ + auVar30._0_4_) * 0.5;
  CVar40.y = (float)uVar18 * fVar26 * (auVar24._4_4_ + auVar30._4_4_) * 0.5;
  CVar40.z = (auVar28._4_4_ + auVar28._0_4_) * 0.5 * fVar26 * albedo->z;
  return CVar40;
}

Assistant:

Color f(const Color& albedo, const vec3f& wo, const vec3f& wi) const override
	{
		vec3f wm = normalized(wo+wi); // microfacet normal
		float cos = dot(wm,wo);
		Color t1 = (eta*eta + k*k) * (cos*cos);
		Color r1 = (t1 - 2*eta*cos + 1) / (t1 + 2*eta*cos + 1);
		Color t2 = eta*eta + k*k;
		Color r2 = (t2 - 2*eta*cos + Color(cos*cos)) / (t2 + 2*eta*cos + Color(cos*cos));
		Color Fres = 0.5 * (r1 + r2); // reflected energy
		return EDX::GGX_D(wm,alpha) * EDX::Smith_G(wo,wi,wm,alpha) / (4 * wo.z * wi.z) * Fres * albedo;
	}